

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm_cod.c
# Opt level: O0

int pnm_fmt(uint_fast16_t magic)

{
  undefined4 local_14;
  int fmt;
  uint_fast16_t magic_local;
  
  if (magic - 0x5031 < 3) {
    local_14 = 0;
  }
  else {
    if (2 < magic - 0x5034) {
      abort();
    }
    local_14 = 1;
  }
  return local_14;
}

Assistant:

int pnm_fmt(uint_fast16_t magic)
{
	int fmt;
	switch (magic) {
	case PNM_MAGIC_TXTPBM:
	case PNM_MAGIC_TXTPGM:
	case PNM_MAGIC_TXTPPM:
		fmt = PNM_FMT_TXT;
		break;
	case PNM_MAGIC_BINPBM:
	case PNM_MAGIC_BINPGM:
	case PNM_MAGIC_BINPPM:
		fmt = PNM_FMT_BIN;
		break;
	default:
		/* This should not happen. */
		abort();
		break;
	}
	return fmt;
}